

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestSpec *spec)

{
  uint uVar1;
  ostream *poVar2;
  string *psVar3;
  ostringstream stream;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Test ",5);
  uVar1 = *(uint *)(this + 4);
  if ((uVar1 & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"atomicCounter()",0xf);
    uVar1 = *(uint *)(this + 4);
  }
  if ((uVar1 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190," atomicCounterIncrement()",0x19);
    uVar1 = *(uint *)(this + 4);
  }
  if ((uVar1 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190," atomicCounterDecrement()",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," calls with ",0xc);
  if (this[0xc] == (_anonymous_namespace_)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," branches, ",0xb);
  }
  poVar2 = (ostream *)std::ostream::operator<<(local_190,*(int *)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," atomic counters, ",0x12);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," calls and ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(this + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," threads.",9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  psVar3 = (string *)std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

string specToTestDescription (const AtomicCounterTest::TestSpec& spec)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((spec.operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}

	stream << " calls with ";

	if (spec.useBranches)
		stream << " branches, ";

	stream << spec.atomicCounterCount << " atomic counters, " << spec.callCount << " calls and " << spec.threadCount << " threads.";

	return stream.str();
}